

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O2

SRes crnlib::LzmaEnc_SetProps(CLzmaEncHandle pp,CLzmaEncProps *props2)

{
  SRes SVar1;
  int iVar2;
  uint uVar3;
  CLzmaEncProps props;
  
  props.level = props2->level;
  props.dictSize = props2->dictSize;
  props.lc = props2->lc;
  props.lp = props2->lp;
  props.pb = props2->pb;
  props.algo = props2->algo;
  props.fb = props2->fb;
  props.btMode = props2->btMode;
  props.numHashBytes = props2->numHashBytes;
  props.mc = props2->mc;
  props.writeEndMark = props2->writeEndMark;
  props.numThreads = props2->numThreads;
  LzmaEncProps_Normalize(&props);
  if ((props.dictSize < 0x40000001 && props.pb < 5) && (props.lp < 5 && props.lc < 9)) {
    *(UInt32 *)((long)pp + 0x3d350) = props.dictSize;
    *(UInt32 *)((long)pp + 0x3d354) = props.mc;
    uVar3 = 5;
    if (5 < (uint)props.fb) {
      uVar3 = props.fb;
    }
    if (0x110 < uVar3) {
      uVar3 = 0x111;
    }
    *(uint *)((long)pp + 0x32f68) = uVar3;
    *(int *)((long)pp + 0x33bcc) = props.lc;
    *(int *)((long)pp + 0x33bd0) = props.lp;
    *(int *)((long)pp + 0x33bd4) = props.pb;
    *(uint *)((long)pp + 0x3d2e0) = (uint)(props.algo == 0);
    *(int *)((long)pp + 0xa0) = props.btMode;
    if (props.btMode == 0) {
      iVar2 = 4;
    }
    else if (props.numHashBytes < 2) {
      iVar2 = 2;
    }
    else {
      iVar2 = 4;
      if ((uint)props.numHashBytes < 4) {
        iVar2 = props.numHashBytes;
      }
    }
    *(int *)((long)pp + 0x98) = iVar2;
    *(UInt32 *)((long)pp + 0x74) = props.mc;
    *(uint *)((long)pp + 0x3d330) = props.writeEndMark;
    SVar1 = 0;
  }
  else {
    SVar1 = 5;
  }
  return SVar1;
}

Assistant:

SRes LzmaEnc_SetProps(CLzmaEncHandle pp, const CLzmaEncProps* props2) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  CLzmaEncProps props = *props2;
  LzmaEncProps_Normalize(&props);

  if (props.lc > LZMA_LC_MAX ||
      props.lp > LZMA_LP_MAX ||
      props.pb > LZMA_PB_MAX ||
      props.dictSize > (1U << kDicLogSizeMaxCompress) ||
      props.dictSize > (1 << 30))
    return SZ_ERROR_PARAM;
  p->dictSize = props.dictSize;
  p->matchFinderCycles = props.mc;
  {
    unsigned fb = props.fb;
    if (fb < 5)
      fb = 5;
    if (fb > LZMA_MATCH_LEN_MAX)
      fb = LZMA_MATCH_LEN_MAX;
    p->numFastBytes = fb;
  }
  p->lc = props.lc;
  p->lp = props.lp;
  p->pb = props.pb;
  p->fastMode = (props.algo == 0);
  p->matchFinderBase.btMode = props.btMode;
  {
    UInt32 numHashBytes = 4;
    if (props.btMode) {
      if (props.numHashBytes < 2)
        numHashBytes = 2;
      else if (props.numHashBytes < 4)
        numHashBytes = props.numHashBytes;
    }
    p->matchFinderBase.numHashBytes = numHashBytes;
  }

  p->matchFinderBase.cutValue = props.mc;

  p->writeEndMark = props.writeEndMark;

#ifdef COMPRESS_MF_MT
  /*
  if (newMultiThread != _multiThread)
  {
    ReleaseMatchFinder();
    _multiThread = newMultiThread;
  }
  */
  p->multiThread = (props.numThreads > 1);
#endif

  return SZ_OK;
}